

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_AddLanes(void *state,uchar *data,uint laneCount)

{
  uint i;
  uint laneCount_local;
  uchar *data_local;
  void *state_local;
  
  for (i = 0; i + 8 <= laneCount; i = i + 8) {
    *(ulong *)((long)state + (ulong)i * 8) =
         *(ulong *)(data + (ulong)i * 8) ^ *(ulong *)((long)state + (ulong)i * 8);
    *(ulong *)((long)state + (ulong)(i + 1) * 8) =
         *(ulong *)(data + (ulong)(i + 1) * 8) ^ *(ulong *)((long)state + (ulong)(i + 1) * 8);
    *(ulong *)((long)state + (ulong)(i + 2) * 8) =
         *(ulong *)(data + (ulong)(i + 2) * 8) ^ *(ulong *)((long)state + (ulong)(i + 2) * 8);
    *(ulong *)((long)state + (ulong)(i + 3) * 8) =
         *(ulong *)(data + (ulong)(i + 3) * 8) ^ *(ulong *)((long)state + (ulong)(i + 3) * 8);
    *(ulong *)((long)state + (ulong)(i + 4) * 8) =
         *(ulong *)(data + (ulong)(i + 4) * 8) ^ *(ulong *)((long)state + (ulong)(i + 4) * 8);
    *(ulong *)((long)state + (ulong)(i + 5) * 8) =
         *(ulong *)(data + (ulong)(i + 5) * 8) ^ *(ulong *)((long)state + (ulong)(i + 5) * 8);
    *(ulong *)((long)state + (ulong)(i + 6) * 8) =
         *(ulong *)(data + (ulong)(i + 6) * 8) ^ *(ulong *)((long)state + (ulong)(i + 6) * 8);
    *(ulong *)((long)state + (ulong)(i + 7) * 8) =
         *(ulong *)(data + (ulong)(i + 7) * 8) ^ *(ulong *)((long)state + (ulong)(i + 7) * 8);
  }
  for (; i + 4 <= laneCount; i = i + 4) {
    *(ulong *)((long)state + (ulong)i * 8) =
         *(ulong *)(data + (ulong)i * 8) ^ *(ulong *)((long)state + (ulong)i * 8);
    *(ulong *)((long)state + (ulong)(i + 1) * 8) =
         *(ulong *)(data + (ulong)(i + 1) * 8) ^ *(ulong *)((long)state + (ulong)(i + 1) * 8);
    *(ulong *)((long)state + (ulong)(i + 2) * 8) =
         *(ulong *)(data + (ulong)(i + 2) * 8) ^ *(ulong *)((long)state + (ulong)(i + 2) * 8);
    *(ulong *)((long)state + (ulong)(i + 3) * 8) =
         *(ulong *)(data + (ulong)(i + 3) * 8) ^ *(ulong *)((long)state + (ulong)(i + 3) * 8);
  }
  for (; i + 2 <= laneCount; i = i + 2) {
    *(ulong *)((long)state + (ulong)i * 8) =
         *(ulong *)(data + (ulong)i * 8) ^ *(ulong *)((long)state + (ulong)i * 8);
    *(ulong *)((long)state + (ulong)(i + 1) * 8) =
         *(ulong *)(data + (ulong)(i + 1) * 8) ^ *(ulong *)((long)state + (ulong)(i + 1) * 8);
  }
  if (i < laneCount) {
    *(ulong *)((long)state + (ulong)i * 8) =
         *(ulong *)(data + (ulong)i * 8) ^ *(ulong *)((long)state + (ulong)i * 8);
  }
  return;
}

Assistant:

void KeccakP1600_AddLanes(void *state, const unsigned char *data, unsigned int laneCount)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    unsigned int i = 0;
#ifdef NO_MISALIGNED_ACCESSES
    /* If either pointer is misaligned, fall back to byte-wise xor. */
    if (((((uintptr_t)state) & 7) != 0) || ((((uintptr_t)data) & 7) != 0)) {
      for (i = 0; i < laneCount * 8; i++) {
        ((unsigned char*)state)[i] ^= data[i];
      }
    }
    else
#endif
    {
      /* Otherwise... */
      for( ; (i+8)<=laneCount; i+=8) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
          ((uint64_t*)state)[i+2] ^= ((uint64_t*)data)[i+2];
          ((uint64_t*)state)[i+3] ^= ((uint64_t*)data)[i+3];
          ((uint64_t*)state)[i+4] ^= ((uint64_t*)data)[i+4];
          ((uint64_t*)state)[i+5] ^= ((uint64_t*)data)[i+5];
          ((uint64_t*)state)[i+6] ^= ((uint64_t*)data)[i+6];
          ((uint64_t*)state)[i+7] ^= ((uint64_t*)data)[i+7];
      }
      for( ; (i+4)<=laneCount; i+=4) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
          ((uint64_t*)state)[i+2] ^= ((uint64_t*)data)[i+2];
          ((uint64_t*)state)[i+3] ^= ((uint64_t*)data)[i+3];
      }
      for( ; (i+2)<=laneCount; i+=2) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
      }
      if (i<laneCount) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
      }
    }
#else
    unsigned int i;
    const uint8_t *curData = data;
    for(i=0; i<laneCount; i++, curData+=8) {
        uint64_t lane = (uint64_t)curData[0]
            | ((uint64_t)curData[1] <<  8)
            | ((uint64_t)curData[2] << 16)
            | ((uint64_t)curData[3] << 24)
            | ((uint64_t)curData[4] << 32)
            | ((uint64_t)curData[5] << 40)
            | ((uint64_t)curData[6] << 48)
            | ((uint64_t)curData[7] << 56);
        ((uint64_t*)state)[i] ^= lane;
    }
#endif
}